

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

void __thiscall
btMultiBody::forwardKinematics
          (btMultiBody *this,btAlignedObjectArray<btQuaternion> *world_to_local,
          btAlignedObjectArray<btVector3> *param_2)

{
  btScalar *pbVar1;
  undefined8 *puVar2;
  btScalar (*pabVar3) [4];
  uint uVar4;
  btMatrix3x3 *pbVar5;
  btQuaternion *pbVar6;
  btVector3 *pbVar7;
  btMultibodyLink *pbVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int newsize;
  long lVar14;
  long lVar15;
  btQuadWord bVar16;
  btVector3 bVar17;
  btVector3 posr;
  btQuaternion local_80;
  btTransform tr;
  
  uVar4 = (this->m_links).m_size;
  pbVar5 = (this->m_matrixBuf).m_data;
  btMatrix3x3::setRotation(&tr.m_basis,&this->m_baseQuat);
  *(ulong *)pbVar5->m_el[0].m_floats =
       CONCAT44(tr.m_basis.m_el[0].m_floats[1],tr.m_basis.m_el[0].m_floats[0]);
  *(ulong *)(pbVar5->m_el[0].m_floats + 2) =
       CONCAT44(tr.m_basis.m_el[0].m_floats[3],tr.m_basis.m_el[0].m_floats[2]);
  *(ulong *)pbVar5->m_el[1].m_floats =
       CONCAT44(tr.m_basis.m_el[1].m_floats[1],tr.m_basis.m_el[1].m_floats[0]);
  *(undefined8 *)(pbVar5->m_el[1].m_floats + 2) = tr.m_basis.m_el[1].m_floats._8_8_;
  uVar13 = 0;
  uVar10 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar10 = uVar13;
  }
  *(undefined8 *)pbVar5->m_el[2].m_floats = tr.m_basis.m_el[2].m_floats._0_8_;
  *(undefined8 *)(pbVar5->m_el[2].m_floats + 2) = tr.m_basis.m_el[2].m_floats._8_8_;
  lVar11 = 0x150;
  for (; uVar10 * 0x30 - uVar13 != 0; uVar13 = uVar13 + 0x30) {
    btMatrix3x3::setRotation
              (&tr.m_basis,
               (btQuaternion *)
               ((long)(((this->m_links).m_data)->m_inertiaLocal).m_floats + lVar11 + -4));
    puVar2 = (undefined8 *)((long)pbVar5[1].m_el[0].m_floats + uVar13);
    *puVar2 = CONCAT44(tr.m_basis.m_el[0].m_floats[1],tr.m_basis.m_el[0].m_floats[0]);
    puVar2[1] = CONCAT44(tr.m_basis.m_el[0].m_floats[3],tr.m_basis.m_el[0].m_floats[2]);
    puVar2 = (undefined8 *)((long)pbVar5[1].m_el[1].m_floats + uVar13);
    *puVar2 = CONCAT44(tr.m_basis.m_el[1].m_floats[1],tr.m_basis.m_el[1].m_floats[0]);
    puVar2[1] = tr.m_basis.m_el[1].m_floats._8_8_;
    pbVar1 = (btScalar *)((long)pbVar5[1].m_el[2].m_floats + uVar13);
    *(undefined8 *)pbVar1 = tr.m_basis.m_el[2].m_floats._0_8_;
    *(undefined8 *)(pbVar1 + 2) = tr.m_basis.m_el[2].m_floats._8_8_;
    lVar11 = lVar11 + 600;
  }
  newsize = (this->m_links).m_size + 1;
  btAlignedObjectArray<btQuaternion>::resize(world_to_local,newsize,(btQuaternion *)&tr);
  btAlignedObjectArray<btVector3>::resize(param_2,newsize,(btVector3 *)&tr);
  pbVar6 = world_to_local->m_data;
  uVar9 = *(undefined8 *)((this->m_baseQuat).super_btQuadWord.m_floats + 2);
  *(undefined8 *)(pbVar6->super_btQuadWord).m_floats =
       *(undefined8 *)(this->m_baseQuat).super_btQuadWord.m_floats;
  *(undefined8 *)((pbVar6->super_btQuadWord).m_floats + 2) = uVar9;
  pbVar7 = param_2->m_data;
  uVar9 = *(undefined8 *)((this->m_basePos).m_floats + 2);
  *(undefined8 *)pbVar7->m_floats = *(undefined8 *)(this->m_basePos).m_floats;
  *(undefined8 *)(pbVar7->m_floats + 2) = uVar9;
  lVar12 = 0x160;
  lVar11 = 0x10;
  for (lVar15 = 0; uVar10 = (ulong)(this->m_links).m_size, lVar15 < (long)uVar10;
      lVar15 = lVar15 + 1) {
    pbVar8 = (this->m_links).m_data;
    lVar14 = (long)*(int *)((long)pbVar8 + lVar12 + -0x14c);
    bVar16.m_floats =
         (btScalar  [4])
         operator*((btQuaternion *)((long)(pbVar8->m_inertiaLocal).m_floats + lVar12 + -0x14),
                   world_to_local->m_data + lVar14 + 1);
    *&((btQuadWord *)((long)(world_to_local->m_data->super_btQuadWord).m_floats + lVar11))->m_floats
         = bVar16.m_floats;
    pbVar7 = param_2->m_data;
    posr.m_floats =
         (btScalar  [4])
         btQuaternion::inverse
                   ((btQuaternion *)
                    ((long)(world_to_local->m_data->super_btQuadWord).m_floats + lVar11));
    bVar17 = quatRotate((btQuaternion *)&posr,
                        (btVector3 *)
                        ((long)(((this->m_links).m_data)->m_inertiaLocal).m_floats + lVar12 + -4));
    tr.m_basis.m_el[0].m_floats[0] = bVar17.m_floats[0];
    tr.m_basis.m_el[0].m_floats[1] = bVar17.m_floats[1];
    tr.m_basis.m_el[0].m_floats[2] = bVar17.m_floats[2];
    tr.m_basis.m_el[0].m_floats[3] = bVar17.m_floats[3];
    bVar17 = operator+(pbVar7 + lVar14 + 1,(btVector3 *)&tr);
    *(btScalar (*) [4])((long)param_2->m_data->m_floats + lVar11) = bVar17.m_floats;
    lVar12 = lVar12 + 600;
    lVar11 = lVar11 + 0x10;
  }
  lVar12 = 0x238;
  lVar15 = 0;
  for (lVar11 = 0; lVar11 < (int)uVar10; lVar11 = lVar11 + 1) {
    pabVar3 = (btScalar (*) [4])((long)param_2->m_data[1].m_floats + lVar15);
    tr.m_origin.m_floats._0_8_ = *(undefined8 *)*pabVar3;
    tr.m_origin.m_floats._8_8_ = *(undefined8 *)(*pabVar3 + 2);
    posr.m_floats = *pabVar3;
    pbVar6 = world_to_local->m_data;
    local_80.super_btQuadWord.m_floats[2] =
         -*(btScalar *)((long)pbVar6[1].super_btQuadWord.m_floats + lVar15 + 8);
    local_80.super_btQuadWord.m_floats[3] =
         *(btScalar *)((long)pbVar6[1].super_btQuadWord.m_floats + lVar15 + 0xc);
    local_80.super_btQuadWord.m_floats._0_8_ =
         *(ulong *)((long)pbVar6[1].super_btQuadWord.m_floats + lVar15) ^ 0x8000000080000000;
    tr.m_basis.m_el[0].m_floats[0] = 1.0;
    tr.m_basis.m_el[0].m_floats[1] = 0.0;
    tr.m_basis.m_el[0].m_floats[2] = 0.0;
    tr.m_basis.m_el[0].m_floats[3] = 0.0;
    tr.m_basis.m_el[1].m_floats[0] = 0.0;
    tr.m_basis.m_el[1].m_floats[1] = 1.0;
    tr.m_basis.m_el[1].m_floats[2] = 0.0;
    tr.m_basis.m_el[1].m_floats[3] = 0.0;
    tr.m_basis.m_el[2].m_floats[0] = 0.0;
    tr.m_basis.m_el[2].m_floats[1] = 0.0;
    tr.m_basis.m_el[2].m_floats[2] = 1.0;
    tr.m_basis.m_el[2].m_floats[3] = 0.0;
    btMatrix3x3::setRotation(&tr.m_basis,&local_80);
    pbVar8 = (this->m_links).m_data;
    puVar2 = (undefined8 *)((long)(pbVar8->m_inertiaLocal).m_floats + lVar12 + -0x34);
    *puVar2 = CONCAT44(tr.m_basis.m_el[0].m_floats[1],tr.m_basis.m_el[0].m_floats[0]);
    puVar2[1] = CONCAT44(tr.m_basis.m_el[0].m_floats[3],tr.m_basis.m_el[0].m_floats[2]);
    puVar2 = (undefined8 *)((long)(pbVar8->m_inertiaLocal).m_floats + lVar12 + -0x24);
    *puVar2 = CONCAT44(tr.m_basis.m_el[1].m_floats[1],tr.m_basis.m_el[1].m_floats[0]);
    puVar2[1] = tr.m_basis.m_el[1].m_floats._8_8_;
    pbVar1 = (btScalar *)((long)(pbVar8->m_inertiaLocal).m_floats + lVar12 + -0x14);
    *(undefined8 *)pbVar1 = tr.m_basis.m_el[2].m_floats._0_8_;
    *(undefined8 *)(pbVar1 + 2) = tr.m_basis.m_el[2].m_floats._8_8_;
    pbVar1 = (btScalar *)((long)(pbVar8->m_inertiaLocal).m_floats + lVar12 + -4);
    *(undefined8 *)pbVar1 = tr.m_origin.m_floats._0_8_;
    *(undefined8 *)(pbVar1 + 2) = tr.m_origin.m_floats._8_8_;
    uVar10 = (ulong)(uint)(this->m_links).m_size;
    lVar12 = lVar12 + 600;
    lVar15 = lVar15 + 0x10;
  }
  return;
}

Assistant:

void	btMultiBody::forwardKinematics(btAlignedObjectArray<btQuaternion>& world_to_local,btAlignedObjectArray<btVector3>& local_origin)
{
	
	int num_links = getNumLinks();

	// Cached 3x3 rotation matrices from parent frame to this frame.
	btMatrix3x3* rot_from_parent =(btMatrix3x3 *) &m_matrixBuf[0];

	rot_from_parent[0] = btMatrix3x3(m_baseQuat);				//m_baseQuat assumed to be alias!?
	
	for (int i = 0; i < num_links; ++i) 
	{
		rot_from_parent[i+1] = btMatrix3x3(m_links[i].m_cachedRotParentToThis);
	}
		
	int nLinks = getNumLinks();
	///base + num m_links
	world_to_local.resize(nLinks+1);
	local_origin.resize(nLinks+1);

	world_to_local[0] = getWorldToBaseRot();
	local_origin[0] = getBasePos();
	
	for (int k=0;k<getNumLinks();k++)
	{
		const int parent = getParent(k);
		world_to_local[k+1] = getParentToLocalRot(k) * world_to_local[parent+1];
		local_origin[k+1] = local_origin[parent+1] + (quatRotate(world_to_local[k+1].inverse() , getRVector(k)));
	}

	for (int link=0;link<getNumLinks();link++)
	{
		int index = link+1;

		btVector3 posr = local_origin[index];
		btScalar quat[4]={-world_to_local[index].x(),-world_to_local[index].y(),-world_to_local[index].z(),world_to_local[index].w()};
		btTransform tr;
		tr.setIdentity();
		tr.setOrigin(posr);
		tr.setRotation(btQuaternion(quat[0],quat[1],quat[2],quat[3]));
		getLink(link).m_cachedWorldTransform = tr;
			
	}

}